

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O1

void __thiscall
PacketProcessor::packForeach
          (PacketProcessor *this,void *data,uint32_t size,
          function<void_(unsigned_char_*,_unsigned_long)> *handle)

{
  uint16_t uVar1;
  ushort uVar2;
  type_conflict i;
  long lVar3;
  byte bVar4;
  undefined8 *extraout_RDX;
  PacketProcessor *this_00;
  PacketProcessor *num_bytes;
  PacketProcessor *__return_storage_ptr__;
  uint8_t tmp [4];
  uint8_t tmp_1 [4];
  undefined1 local_4c [4];
  undefined1 local_48 [8];
  PacketProcessor *local_40;
  PacketProcessor *local_38;
  
  local_4c._0_2_ = 0xa55a;
  local_40 = (PacketProcessor *)0x2;
  this_00 = (PacketProcessor *)data;
  __return_storage_ptr__ = this;
  local_48 = (undefined1  [8])local_4c;
  local_38 = this;
  if ((handle->super__Function_base)._M_manager != (_Manager_type)0x0) {
    this_00 = (PacketProcessor *)(local_4c + 4);
    __return_storage_ptr__ = (PacketProcessor *)handle;
    (*handle->_M_invoker)((_Any_data *)handle,(uchar **)this_00,(unsigned_long *)(local_48 + 8));
    local_4c = (undefined1  [4])
               (size >> 0x18 | (size & 0xff0000) >> 8 | (size & 0xff00) << 8 | size << 0x18);
    local_40 = (PacketProcessor *)0x4;
    local_48 = (undefined1  [8])local_4c;
    if ((handle->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*handle->_M_invoker)
                ((_Any_data *)handle,(uchar **)(local_4c + 4),(unsigned_long *)(local_48 + 8));
      this_00 = (PacketProcessor *)0x4;
      __return_storage_ptr__ = (PacketProcessor *)local_4c;
      uVar1 = crc_16((uchar *)local_4c,4);
      local_4c._0_2_ = uVar1 << 8 | uVar1 >> 8;
      local_40 = (PacketProcessor *)0x2;
      local_48 = (undefined1  [8])local_4c;
      if ((handle->super__Function_base)._M_manager != (_Manager_type)0x0) {
        this_00 = (PacketProcessor *)(local_4c + 4);
        __return_storage_ptr__ = (PacketProcessor *)handle;
        (*handle->_M_invoker)((_Any_data *)handle,(uchar **)this_00,(unsigned_long *)(local_48 + 8))
        ;
        num_bytes = (PacketProcessor *)(ulong)size;
        local_48 = (undefined1  [8])data;
        local_40 = num_bytes;
        if ((handle->super__Function_base)._M_manager != (_Manager_type)0x0) {
          local_48 = (undefined1  [8])data;
          (*handle->_M_invoker)
                    ((_Any_data *)handle,(uchar **)(local_4c + 4),(unsigned_long *)(local_48 + 8));
          if (local_38->useCrc_ == true) {
            uVar2 = crc_16((uchar *)data,(size_t)num_bytes);
          }
          else {
            bVar4 = 0x18;
            lVar3 = 0;
            do {
              local_4c[lVar3 + 4] = (char)(size >> (bVar4 & 0x1f));
              lVar3 = lVar3 + 1;
              bVar4 = bVar4 - 8;
            } while (lVar3 != 4);
            data = local_4c + 4;
            num_bytes = (PacketProcessor *)0x4;
            uVar1 = crc_16((uchar *)data,4);
            uVar2 = ~uVar1;
          }
          local_4c._0_2_ = uVar2 << 8 | uVar2 >> 8;
          local_40 = (PacketProcessor *)0x2;
          this_00 = num_bytes;
          __return_storage_ptr__ = (PacketProcessor *)data;
          local_48 = (undefined1  [8])local_4c;
          if ((handle->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*handle->_M_invoker)
                      ((_Any_data *)handle,(uchar **)(local_4c + 4),(unsigned_long *)(local_48 + 8))
            ;
            return;
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
  pack_abi_cxx11_((string *)__return_storage_ptr__,this_00,(void *)*extraout_RDX,
                  *(uint32_t *)(extraout_RDX + 1));
  return;
}

Assistant:

void PacketProcessor::packForeach(const void* data, uint32_t size, const std::function<void(uint8_t* data, size_t size)>& handle) const {
  uint8_t tmp[4];

  tmp[0] = H_1;
  tmp[1] = H_2;
  handle(tmp, 2);

  uint32_t dataSize = size;
  tmp[0] = (dataSize & 0xff000000) >> 8 * 3;
  tmp[1] = (dataSize & 0x00ff0000) >> 8 * 2;
  tmp[2] = (dataSize & 0x0000ff00) >> 8 * 1;
  tmp[3] = (dataSize & 0x000000ff) >> 8 * 0;
  handle(tmp, 4);

  uint16_t sizeCrc = crc_16(tmp, 4);
  tmp[0] = (sizeCrc & 0xff00) >> 8 * 1;
  tmp[1] = (sizeCrc & 0x00ff) >> 8 * 0;
  handle(tmp, 2);

  handle((uint8_t*)data, size);

  uint16_t crcSum = useCrc_ ? crc_16((uint8_t*)data, size) : ~calCrc(size);
  tmp[0] = (crcSum & 0xff00) >> 8 * 1;
  tmp[1] = (crcSum & 0x00ff) >> 8 * 0;
  handle(tmp, 2);
}